

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void yy_destructor(yyParser *yypParser,uchar yymajor,YYMINORTYPE *yypminor)

{
  undefined7 in_register_00000031;
  Parse *pParse;
  
  switch((int)CONCAT71(in_register_00000031,yymajor)) {
  case 0xa3:
  case 0xc3:
  case 0xc4:
  case 0xcf:
    clearSelect(*(sqlite3 **)yypParser,yypminor->yy3,1);
    return;
  default:
    return;
  case 0xae:
  case 0xaf:
  case 0xca:
  case 0xcc:
  case 0xd8:
  case 0xe3:
  case 0xe5:
  case 0xee:
  case 0xf3:
    sqlite3ExprDelete(*(sqlite3 **)yypParser,yypminor->yy132);
    return;
  case 0xb3:
  case 0xbc:
  case 200:
  case 0xcb:
  case 0xcd:
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xdc:
  case 0xdd:
  case 0xe4:
    sqlite3ExprListDelete(*(sqlite3 **)yypParser,yypminor->yy14);
    return;
  case 0xc2:
  case 0xc9:
  case 0xd4:
  case 0xd5:
    sqlite3SrcListDelete(*(sqlite3 **)yypParser,yypminor->yy65);
    return;
  case 0xc5:
  case 0xfc:
    sqlite3WithDelete(*(sqlite3 **)yypParser,yypminor->yy59);
    return;
  case 0xd9:
  case 0xdb:
  case 0xdf:
    sqlite3IdListDelete(*(sqlite3 **)yypParser,yypminor->yy408);
    return;
  case 0xea:
  case 0xef:
    sqlite3DeleteTriggerStep(*(sqlite3 **)yypParser,yypminor->yy473);
    return;
  case 0xec:
    sqlite3IdListDelete(*(sqlite3 **)yypParser,(yypminor->yy378).b);
    return;
  }
}

Assistant:

static void yy_destructor(
  yyParser *yypParser,    /* The parser */
  YYCODETYPE yymajor,     /* Type code for object to destroy */
  YYMINORTYPE *yypminor   /* The object to be destroyed */
){
  sqlite3ParserARG_FETCH;
  switch( yymajor ){
    /* Here is inserted the actions which take place when a
    ** terminal or non-terminal is destroyed.  This can happen
    ** when the symbol is popped from the stack during a
    ** reduce or during error processing or when a parser is 
    ** being destroyed before it is finished parsing.
    **
    ** Note: during a reduce, the only symbols destroyed are those
    ** which appear on the RHS of the rule, but which are not used
    ** inside the C code.
    */
    case 163: /* select */
    case 195: /* selectnowith */
    case 196: /* oneselect */
    case 207: /* values */
{
sqlite3SelectDelete(pParse->db, (yypminor->yy3));
}
      break;
    case 174: /* term */
    case 175: /* expr */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy346).pExpr);
}
      break;
    case 179: /* idxlist_opt */
    case 188: /* idxlist */
    case 200: /* selcollist */
    case 203: /* groupby_opt */
    case 205: /* orderby_opt */
    case 208: /* nexprlist */
    case 209: /* exprlist */
    case 210: /* sclp */
    case 220: /* sortlist */
    case 221: /* setlist */
    case 228: /* case_exprlist */
{
sqlite3ExprListDelete(pParse->db, (yypminor->yy14));
}
      break;
    case 194: /* fullname */
    case 201: /* from */
    case 212: /* seltablist */
    case 213: /* stl_prefix */
{
sqlite3SrcListDelete(pParse->db, (yypminor->yy65));
}
      break;
    case 197: /* with */
    case 252: /* wqlist */
{
sqlite3WithDelete(pParse->db, (yypminor->yy59));
}
      break;
    case 202: /* where_opt */
    case 204: /* having_opt */
    case 216: /* on_opt */
    case 227: /* case_operand */
    case 229: /* case_else */
    case 238: /* when_clause */
    case 243: /* key_opt */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy132));
}
      break;
    case 217: /* using_opt */
    case 219: /* idlist */
    case 223: /* inscollist_opt */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy408));
}
      break;
    case 234: /* trigger_cmd_list */
    case 239: /* trigger_cmd */
{
sqlite3DeleteTriggerStep(pParse->db, (yypminor->yy473));
}
      break;
    case 236: /* trigger_event */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy378).b);
}
      break;
    default:  break;   /* If no destructor action specified: do nothing */
  }
}